

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logical_positional_join.cpp
# Opt level: O3

void __thiscall
duckdb::LogicalPositionalJoin::LogicalPositionalJoin
          (LogicalPositionalJoin *this,
          unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
          *left,unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                *right)

{
  vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
  *this_00;
  ulong uVar1;
  reference pvVar2;
  pointer pLVar3;
  pointer *__ptr;
  ulong _estimated_cardinality;
  _Head_base<0UL,_duckdb::LogicalOperator_*,_false> local_28;
  _Head_base<0UL,_duckdb::LogicalOperator_*,_false> local_20;
  
  local_20._M_head_impl =
       (left->
       super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>).
       _M_t.
       super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
       .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
  (left->super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>).
  _M_t.super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>.
  super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl = (LogicalOperator *)0x0;
  local_28._M_head_impl =
       (right->
       super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>).
       _M_t.
       super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
       .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
  (right->super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>).
  _M_t.super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>.
  super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl = (LogicalOperator *)0x0;
  LogicalUnconditionalJoin::LogicalUnconditionalJoin
            (&this->super_LogicalUnconditionalJoin,LOGICAL_POSITIONAL_JOIN,
             (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
              *)&local_20,
             (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
              *)&local_28);
  if (local_28._M_head_impl != (LogicalOperator *)0x0) {
    (*(local_28._M_head_impl)->_vptr_LogicalOperator[1])();
  }
  local_28._M_head_impl = (LogicalOperator *)0x0;
  if (local_20._M_head_impl != (LogicalOperator *)0x0) {
    (*(local_20._M_head_impl)->_vptr_LogicalOperator[1])();
  }
  local_20._M_head_impl = (LogicalOperator *)0x0;
  (this->super_LogicalUnconditionalJoin).super_LogicalOperator._vptr_LogicalOperator =
       (_func_int **)&PTR__LogicalOperator_02469758;
  this_00 = &(this->super_LogicalUnconditionalJoin).super_LogicalOperator.children;
  pvVar2 = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
           ::operator[](this_00,0);
  pLVar3 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>::
           operator->(pvVar2);
  uVar1 = pLVar3->estimated_cardinality;
  pvVar2 = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
           ::operator[](this_00,1);
  pLVar3 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>::
           operator->(pvVar2);
  _estimated_cardinality = pLVar3->estimated_cardinality;
  if (pLVar3->estimated_cardinality < uVar1) {
    _estimated_cardinality = uVar1;
  }
  LogicalOperator::SetEstimatedCardinality((LogicalOperator *)this,_estimated_cardinality);
  return;
}

Assistant:

LogicalPositionalJoin::LogicalPositionalJoin(unique_ptr<LogicalOperator> left, unique_ptr<LogicalOperator> right)
    : LogicalUnconditionalJoin(LogicalOperatorType::LOGICAL_POSITIONAL_JOIN, std::move(left), std::move(right)) {
	SetEstimatedCardinality(MaxValue(children[0]->estimated_cardinality, children[1]->estimated_cardinality));
}